

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O3

uint64_t absl::lts_20250127::str_format_internal::FormatConversionCharToConvInt(char conv)

{
  undefined7 in_register_00000039;
  
  switch((int)CONCAT71(in_register_00000039,conv)) {
  case 0x58:
    return 0x100;
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x77:
    goto switchD_0102122d_caseD_59;
  case 0x61:
    return 0x8000;
  case 99:
    return 2;
  case 100:
    return 8;
  case 0x65:
    return 0x800;
  case 0x66:
    return 0x200;
  case 0x67:
    return 0x2000;
  case 0x69:
    return 0x10;
  case 0x6e:
    return 0x20000;
  case 0x6f:
    return 0x20;
  case 0x70:
    return 0x40000;
  case 0x73:
    return 4;
  case 0x75:
    return 0x40;
  case 0x76:
    return 0x80000;
  case 0x78:
    return 0x80;
  default:
    switch((int)CONCAT71(in_register_00000039,conv)) {
    case 0x41:
      return 0x10000;
    case 0x45:
      return 0x1000;
    case 0x46:
      return 0x400;
    case 0x47:
      return 0x4000;
    }
switchD_0102122d_caseD_59:
    return (ulong)(conv == '*');
  }
}

Assistant:

constexpr uint64_t FormatConversionCharToConvInt(char conv) {
  return
#define ABSL_INTERNAL_CHAR_SET_CASE(c)                                 \
  conv == #c[0]                                                        \
      ? FormatConversionCharToConvInt(FormatConversionCharInternal::c) \
      :
      ABSL_INTERNAL_CONVERSION_CHARS_EXPAND_(ABSL_INTERNAL_CHAR_SET_CASE, )
#undef ABSL_INTERNAL_CHAR_SET_CASE
                  conv == '*'
          ? 1
          : 0;
}